

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# env_posix.cc
# Opt level: O1

void __thiscall
leveldb::anon_unknown_1::PosixSequentialFile::~PosixSequentialFile(PosixSequentialFile *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  long lVar2;
  pointer pcVar3;
  long in_FS_OFFSET;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  close(this->fd_);
  pcVar3 = (this->filename_)._M_dataplus._M_p;
  paVar1 = &(this->filename_).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 != paVar1) {
    operator_delete(pcVar3,paVar1->_M_allocated_capacity + 1);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
    SequentialFile::~SequentialFile(&this->super_SequentialFile);
    return;
  }
  __stack_chk_fail();
}

Assistant:

Status Read(size_t n, Slice* result, char* scratch) override {
    Status status;
    while (true) {
      ::ssize_t read_size = ::read(fd_, scratch, n);
      if (read_size < 0) {  // Read error.
        if (errno == EINTR) {
          continue;  // Retry
        }
        status = PosixError(filename_, errno);
        break;
      }
      *result = Slice(scratch, read_size);
      break;
    }
    return status;
  }